

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int whereLoopAddVirtual(WhereLoopBuilder *pBuilder,Bitmask mPrereq,Bitmask mUnusable)

{
  int *piVar1;
  byte bVar2;
  uint uVar3;
  SrcList *pSVar4;
  ExprList *pEVar5;
  Parse *pParse;
  Expr *pEVar6;
  Bitmask BVar7;
  WhereLoop *pWVar8;
  u8 uVar9;
  ushort uVar10;
  int iVar11;
  uint uVar12;
  undefined4 uVar13;
  sqlite3_index_info *psVar14;
  Select *pSVar15;
  uint uVar16;
  int iVar17;
  ulong uVar18;
  ExprList_item *pEVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  WhereTerm *pWVar23;
  ulong uVar24;
  u16 *puVar25;
  ushort uVar26;
  ulong uVar27;
  u16 mNoOmit;
  uint uVar28;
  long lVar29;
  ulong uVar30;
  uint uVar31;
  int bIn;
  int local_84;
  sqlite3_index_info *local_80;
  long local_78;
  Bitmask local_70;
  WhereLoopBuilder *local_68;
  uint local_5c;
  Parse *local_58;
  WhereLoop *local_50;
  ulong local_48;
  ulong local_40;
  WhereClause *local_38;
  
  local_38 = pBuilder->pWC;
  pSVar4 = pBuilder->pWInfo->pTabList;
  local_50 = pBuilder->pNew;
  bVar2 = local_50->iTab;
  local_58 = (Parse *)(pSVar4->a + bVar2);
  pEVar5 = pBuilder->pOrderBy;
  iVar17 = local_38->nTerm;
  iVar11 = 0;
  if (0 < iVar17) {
    puVar25 = &local_38->a->eOperator;
    iVar11 = 0;
    do {
      if ((*(int *)(puVar25 + 4) == pSVar4->a[bVar2].iCursor) &&
         ((*(ulong *)(puVar25 + 0xe) & mUnusable) == 0)) {
        iVar11 = (iVar11 + 1) - (uint)((*puVar25 & 0xf7ff) == 0);
      }
      puVar25 = puVar25 + 0x20;
      iVar17 = iVar17 + -1;
    } while (iVar17 != 0);
  }
  pParse = pBuilder->pWInfo->pParse;
  uVar31 = 0;
  if (pEVar5 != (ExprList *)0x0) {
    uVar3 = pEVar5->nExpr;
    uVar18 = 0;
    if (0 < (int)uVar3) {
      pEVar19 = pEVar5->a;
      uVar18 = 0;
      do {
        if ((pEVar19->pExpr->op != 0x9e) || (pEVar19->pExpr->iTable != pSVar4->a[bVar2].iCursor))
        goto LAB_0017f641;
        uVar18 = uVar18 + 1;
        pEVar19 = pEVar19 + 1;
      } while (uVar3 != uVar18);
      uVar18 = (ulong)uVar3;
    }
LAB_0017f641:
    uVar31 = 0;
    if ((uint)uVar18 == uVar3) {
      uVar31 = uVar3;
    }
  }
  lVar29 = (long)iVar11;
  local_68 = pBuilder;
  psVar14 = (sqlite3_index_info *)
            sqlite3DbMallocZero(pParse->db,(long)(int)uVar31 * 8 + lVar29 * 0x14 + 0x70);
  pWVar8 = local_50;
  if (psVar14 == (sqlite3_index_info *)0x0) {
    sqlite3ErrorMsg(pParse,"out of memory");
  }
  else {
    psVar14->nConstraint = iVar11;
    psVar14->nOrderBy = uVar31;
    psVar14->aConstraint = (sqlite3_index_constraint *)&psVar14[1].nOrderBy;
    psVar14->aOrderBy = (sqlite3_index_orderby *)(&psVar14[1].nOrderBy + lVar29 * 3);
    psVar14->aConstraintUsage =
         (sqlite3_index_constraint_usage *)
         ((sqlite3_index_orderby *)(&psVar14[1].nOrderBy + lVar29 * 3) + (int)uVar31);
    *(WhereClause **)(psVar14 + 1) = local_38;
    psVar14[1].aConstraint = (sqlite3_index_constraint *)pParse;
    uVar3 = local_38->nTerm;
    if ((int)uVar3 < 1) {
      mNoOmit = 0;
    }
    else {
      pWVar23 = local_38->a;
      iVar17 = local_58->szOpAlloc;
      uVar16 = 0;
      iVar11 = 0;
      uVar28 = 0;
      do {
        if ((((pWVar23->leftCursor == iVar17) && ((pWVar23->prereqRight & mUnusable) == 0)) &&
            (uVar26 = pWVar23->eOperator, (uVar26 & 0xf7ff) != 0)) &&
           ((((((anon_struct_4_7_7ffbf296_for_fg *)&local_58->nOpAlloc)->jointype & 8) == 0 ||
             ((uVar26 & 0x180) == 0)) || ((pWVar23->pExpr->flags & 1) != 0)))) {
          piVar1 = &psVar14[1].nOrderBy + (long)iVar11 * 3;
          *piVar1 = (pWVar23->u).leftColumn;
          piVar1[2] = uVar16;
          uVar26 = uVar26 & 0x1fff;
          uVar10 = uVar26;
          if (uVar26 == 1) {
            uVar10 = 2;
          }
          if (uVar10 == 0x40) {
            uVar9 = pWVar23->eMatchOp;
LAB_0017f77f:
            *(u8 *)(piVar1 + 1) = uVar9;
          }
          else {
            if ((uVar10 & 0x180) != 0) {
              uVar9 = 'H' - (uVar10 == 0x100);
              goto LAB_0017f77f;
            }
            *(char *)(piVar1 + 1) = (char)uVar10;
            if ((uVar10 & 0x3c) != 0) {
              pEVar6 = pWVar23->pExpr->pRight;
              uVar9 = pEVar6->op;
              if (uVar9 == 0xa4) {
                uVar9 = pEVar6->op2;
              }
              if (uVar9 == '\x7f') {
                pSVar15 = (pEVar6->x).pSelect;
              }
              else {
                if (uVar9 != 0xa5) goto LAB_0017f783;
                pSVar15 = (Select *)&pEVar6->x;
              }
              if (1 < ((anon_union_8_2_a01b6dbf_for_x *)&pSVar15->pEList)->pList->nExpr) {
                uVar12 = 1 << ((byte)uVar16 & 0x1f);
                if (0xf < uVar16) {
                  uVar12 = 0;
                }
                uVar28 = uVar28 | uVar12;
                if (uVar26 == 0x10) {
                  uVar9 = '\b';
                }
                else {
                  if (uVar26 != 4) goto LAB_0017f783;
                  uVar9 = ' ';
                }
                goto LAB_0017f77f;
              }
            }
          }
LAB_0017f783:
          iVar11 = iVar11 + 1;
        }
        mNoOmit = (u16)uVar28;
        uVar16 = uVar16 + 1;
        pWVar23 = pWVar23 + 1;
        local_78 = lVar29 * 3;
      } while (uVar3 != uVar16);
    }
    if (0 < (int)uVar31) {
      pEVar19 = pEVar5->a;
      uVar18 = 0;
      do {
        (&psVar14[1].nOrderBy)[lVar29 * 3 + uVar18 * 2] = (int)pEVar19->pExpr->iColumn;
        (&psVar14[1].field_0x14)[uVar18 * 8 + lVar29 * 0xc] = pEVar19->sortOrder;
        uVar18 = uVar18 + 1;
        pEVar19 = pEVar19 + 1;
      } while (uVar31 != uVar18);
    }
    local_50->rSetup = 0;
    local_50->wsFlags = 0x400;
    local_50->nLTerm = 0;
    (local_50->u).vtab.needFree = '\0';
    uVar31 = psVar14->nConstraint;
    local_80 = psVar14;
    local_70 = mPrereq;
    iVar17 = whereLoopResize(pParse->db,local_50,uVar31);
    if (iVar17 == 0) {
      local_58 = pParse;
      iVar17 = whereLoopAddVirtualOne
                         (local_68,local_70,0xffffffffffffffff,0,psVar14,mNoOmit,&local_84);
      psVar14 = local_80;
      if (iVar17 == 0) {
        uVar30 = ~local_70;
        uVar18 = pWVar8->prereq & uVar30;
        iVar17 = 0;
        if (uVar18 != 0) {
          if (local_84 == 0) {
            uVar27 = 0;
            local_5c = 0;
          }
          else {
            iVar17 = whereLoopAddVirtualOne
                               (local_68,local_70,0xffffffffffffffff,1,local_80,mNoOmit,&local_84);
            uVar27 = local_50->prereq & uVar30;
            psVar14 = local_80;
            if (iVar17 != 0) goto LAB_0017f904;
            local_5c = (uint)(uVar27 == 0);
          }
          local_78 = CONCAT44(local_78._4_4_,local_5c);
          uVar20 = 0;
          psVar14 = local_80;
          local_48 = uVar27;
          local_40 = uVar18;
          do {
            BVar7 = local_70;
            if ((int)uVar31 < 1) {
LAB_0017faa8:
              iVar17 = 0;
              if (local_5c == 0) {
                iVar17 = whereLoopAddVirtualOne
                                   (local_68,local_70,local_70,0,psVar14,mNoOmit,&local_84);
                psVar14 = local_80;
                iVar11 = (int)local_78;
                if (local_84 == 0) {
                  iVar11 = 1;
                }
              }
              else {
                iVar11 = (int)local_78;
              }
              if (iVar11 == 0 && iVar17 == 0) {
                iVar17 = whereLoopAddVirtualOne
                                   (local_68,local_70,local_70,1,psVar14,mNoOmit,&local_84);
                psVar14 = local_80;
              }
              break;
            }
            lVar29 = 0;
            uVar21 = 0xffffffffffffffff;
            do {
              uVar24 = local_38->a[*(int *)((long)&psVar14->aConstraint->iTermOffset + lVar29)].
                       prereqRight & uVar30;
              uVar22 = uVar21;
              if (uVar24 < uVar21) {
                uVar22 = uVar24;
              }
              if (uVar24 <= uVar20) {
                uVar22 = uVar21;
              }
              lVar29 = lVar29 + 0xc;
              uVar21 = uVar22;
            } while ((ulong)uVar31 * 0xc != lVar29);
            if (uVar22 == 0xffffffffffffffff) goto LAB_0017faa8;
            iVar17 = 0;
            if (((uVar22 != uVar18) && (uVar22 != uVar27)) &&
               (iVar17 = whereLoopAddVirtualOne
                                   (local_68,local_70,uVar22 | local_70,0,psVar14,mNoOmit,&local_84)
               , psVar14 = local_80, uVar27 = local_48, uVar18 = local_40, local_50->prereq == BVar7
               )) {
              local_5c = 1;
              uVar13 = (int)local_78;
              if (local_84 == 0) {
                uVar13 = 1;
              }
              local_78 = CONCAT44(local_78._4_4_,uVar13);
            }
            uVar20 = uVar22;
          } while (iVar17 == 0);
        }
      }
LAB_0017f904:
      if (psVar14->needToFreeIdxStr != 0) {
        sqlite3_free(psVar14->idxStr);
        psVar14 = local_80;
      }
      sqlite3DbFreeNN(local_58->db,psVar14);
      return iVar17;
    }
    sqlite3DbFreeNN(pParse->db,psVar14);
  }
  return 7;
}

Assistant:

static int whereLoopAddVirtual(
  WhereLoopBuilder *pBuilder,  /* WHERE clause information */
  Bitmask mPrereq,             /* Tables that must be scanned before this one */
  Bitmask mUnusable            /* Tables that must be scanned after this one */
){
  int rc = SQLITE_OK;          /* Return code */
  WhereInfo *pWInfo;           /* WHERE analysis context */
  Parse *pParse;               /* The parsing context */
  WhereClause *pWC;            /* The WHERE clause */
  struct SrcList_item *pSrc;   /* The FROM clause term to search */
  sqlite3_index_info *p;       /* Object to pass to xBestIndex() */
  int nConstraint;             /* Number of constraints in p */
  int bIn;                     /* True if plan uses IN(...) operator */
  WhereLoop *pNew;
  Bitmask mBest;               /* Tables used by best possible plan */
  u16 mNoOmit;

  assert( (mPrereq & mUnusable)==0 );
  pWInfo = pBuilder->pWInfo;
  pParse = pWInfo->pParse;
  pWC = pBuilder->pWC;
  pNew = pBuilder->pNew;
  pSrc = &pWInfo->pTabList->a[pNew->iTab];
  assert( IsVirtual(pSrc->pTab) );
  p = allocateIndexInfo(pParse, pWC, mUnusable, pSrc, pBuilder->pOrderBy, 
      &mNoOmit);
  if( p==0 ) return SQLITE_NOMEM_BKPT;
  pNew->rSetup = 0;
  pNew->wsFlags = WHERE_VIRTUALTABLE;
  pNew->nLTerm = 0;
  pNew->u.vtab.needFree = 0;
  nConstraint = p->nConstraint;
  if( whereLoopResize(pParse->db, pNew, nConstraint) ){
    sqlite3DbFree(pParse->db, p);
    return SQLITE_NOMEM_BKPT;
  }

  /* First call xBestIndex() with all constraints usable. */
  WHERETRACE(0x800, ("BEGIN %s.addVirtual()\n", pSrc->pTab->zName));
  WHERETRACE(0x40, ("  VirtualOne: all usable\n"));
  rc = whereLoopAddVirtualOne(pBuilder, mPrereq, ALLBITS, 0, p, mNoOmit, &bIn);

  /* If the call to xBestIndex() with all terms enabled produced a plan
  ** that does not require any source tables (IOW: a plan with mBest==0),
  ** then there is no point in making any further calls to xBestIndex() 
  ** since they will all return the same result (if the xBestIndex()
  ** implementation is sane). */
  if( rc==SQLITE_OK && (mBest = (pNew->prereq & ~mPrereq))!=0 ){
    int seenZero = 0;             /* True if a plan with no prereqs seen */
    int seenZeroNoIN = 0;         /* Plan with no prereqs and no IN(...) seen */
    Bitmask mPrev = 0;
    Bitmask mBestNoIn = 0;

    /* If the plan produced by the earlier call uses an IN(...) term, call
    ** xBestIndex again, this time with IN(...) terms disabled. */
    if( bIn ){
      WHERETRACE(0x40, ("  VirtualOne: all usable w/o IN\n"));
      rc = whereLoopAddVirtualOne(
          pBuilder, mPrereq, ALLBITS, WO_IN, p, mNoOmit, &bIn);
      assert( bIn==0 );
      mBestNoIn = pNew->prereq & ~mPrereq;
      if( mBestNoIn==0 ){
        seenZero = 1;
        seenZeroNoIN = 1;
      }
    }

    /* Call xBestIndex once for each distinct value of (prereqRight & ~mPrereq) 
    ** in the set of terms that apply to the current virtual table.  */
    while( rc==SQLITE_OK ){
      int i;
      Bitmask mNext = ALLBITS;
      assert( mNext>0 );
      for(i=0; i<nConstraint; i++){
        Bitmask mThis = (
            pWC->a[p->aConstraint[i].iTermOffset].prereqRight & ~mPrereq
        );
        if( mThis>mPrev && mThis<mNext ) mNext = mThis;
      }
      mPrev = mNext;
      if( mNext==ALLBITS ) break;
      if( mNext==mBest || mNext==mBestNoIn ) continue;
      WHERETRACE(0x40, ("  VirtualOne: mPrev=%04llx mNext=%04llx\n",
                       (sqlite3_uint64)mPrev, (sqlite3_uint64)mNext));
      rc = whereLoopAddVirtualOne(
          pBuilder, mPrereq, mNext|mPrereq, 0, p, mNoOmit, &bIn);
      if( pNew->prereq==mPrereq ){
        seenZero = 1;
        if( bIn==0 ) seenZeroNoIN = 1;
      }
    }

    /* If the calls to xBestIndex() in the above loop did not find a plan
    ** that requires no source tables at all (i.e. one guaranteed to be
    ** usable), make a call here with all source tables disabled */
    if( rc==SQLITE_OK && seenZero==0 ){
      WHERETRACE(0x40, ("  VirtualOne: all disabled\n"));
      rc = whereLoopAddVirtualOne(
          pBuilder, mPrereq, mPrereq, 0, p, mNoOmit, &bIn);
      if( bIn==0 ) seenZeroNoIN = 1;
    }

    /* If the calls to xBestIndex() have so far failed to find a plan
    ** that requires no source tables at all and does not use an IN(...)
    ** operator, make a final call to obtain one here.  */
    if( rc==SQLITE_OK && seenZeroNoIN==0 ){
      WHERETRACE(0x40, ("  VirtualOne: all disabled and w/o IN\n"));
      rc = whereLoopAddVirtualOne(
          pBuilder, mPrereq, mPrereq, WO_IN, p, mNoOmit, &bIn);
    }
  }

  if( p->needToFreeIdxStr ) sqlite3_free(p->idxStr);
  sqlite3DbFreeNN(pParse->db, p);
  WHERETRACE(0x800, ("END %s.addVirtual(), rc=%d\n", pSrc->pTab->zName, rc));
  return rc;
}